

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeepsMD.cpp
# Opt level: O0

void __thiscall PeepsMD::ProcessImplicitRegs(PeepsMD *this,Instr *instr)

{
  Peeps *pPVar1;
  code *pcVar2;
  bool bVar3;
  RegNum RVar4;
  Opnd *pOVar5;
  RegOpnd *pRVar6;
  undefined4 *puVar7;
  Instr *instr_local;
  PeepsMD *this_local;
  
  bVar3 = LowererMD::IsCall(instr);
  if (bVar3) {
    Peeps::ClearReg(this->peeps,RegRAX);
    Peeps::ClearReg(this->peeps,RegArg3);
    Peeps::ClearReg(this->peeps,RegArg2);
    Peeps::ClearReg(this->peeps,RegArg1);
    Peeps::ClearReg(this->peeps,RegArg0);
    Peeps::ClearReg(this->peeps,RegArg4);
    Peeps::ClearReg(this->peeps,RegArg5);
    Peeps::ClearReg(this->peeps,RegR10);
    Peeps::ClearReg(this->peeps,RegR11);
    Peeps::ClearReg(this->peeps,RegXMM0);
    Peeps::ClearReg(this->peeps,RegXMM1);
    Peeps::ClearReg(this->peeps,RegXMM2);
    Peeps::ClearReg(this->peeps,RegXMM3);
    Peeps::ClearReg(this->peeps,RegXMM4);
    Peeps::ClearReg(this->peeps,RegXMM5);
    Peeps::ClearReg(this->peeps,RegXMM6);
    Peeps::ClearReg(this->peeps,RegXMM7);
    Peeps::ClearReg(this->peeps,RegXMM8);
    Peeps::ClearReg(this->peeps,RegXMM9);
    Peeps::ClearReg(this->peeps,RegXMM10);
    Peeps::ClearReg(this->peeps,RegXMM11);
    Peeps::ClearReg(this->peeps,RegXMM12);
    Peeps::ClearReg(this->peeps,RegXMM13);
    Peeps::ClearReg(this->peeps,RegXMM14);
    Peeps::ClearReg(this->peeps,RegXMM15);
  }
  else if (instr->m_opcode == IMUL) {
    Peeps::ClearReg(this->peeps,RegArg2);
  }
  else if ((instr->m_opcode == IDIV) || (instr->m_opcode == DIV)) {
    pOVar5 = IR::Instr::GetDst(instr);
    pRVar6 = IR::Opnd::AsRegOpnd(pOVar5);
    RVar4 = IR::RegOpnd::GetReg(pRVar6);
    if (RVar4 == RegArg2) {
      Peeps::ClearReg(this->peeps,RegRAX);
    }
    else {
      pOVar5 = IR::Instr::GetDst(instr);
      pRVar6 = IR::Opnd::AsRegOpnd(pOVar5);
      RVar4 = IR::RegOpnd::GetReg(pRVar6);
      if (RVar4 != RegRAX) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PeepsMD.cpp"
                           ,0x28,"(instr->GetDst()->AsRegOpnd()->GetReg() == RegRAX)",
                           "instr->GetDst()->AsRegOpnd()->GetReg() == RegRAX");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      Peeps::ClearReg(this->peeps,RegArg2);
    }
  }
  else if (instr->m_opcode == XCHG) {
    pOVar5 = IR::Instr::GetSrc1(instr);
    bVar3 = IR::Opnd::IsRegOpnd(pOVar5);
    if (bVar3) {
      pPVar1 = this->peeps;
      pOVar5 = IR::Instr::GetSrc1(instr);
      pRVar6 = IR::Opnd::AsRegOpnd(pOVar5);
      RVar4 = IR::RegOpnd::GetReg(pRVar6);
      Peeps::ClearReg(pPVar1,RVar4);
    }
    pOVar5 = IR::Instr::GetSrc2(instr);
    bVar3 = IR::Opnd::IsRegOpnd(pOVar5);
    if (bVar3) {
      pPVar1 = this->peeps;
      pOVar5 = IR::Instr::GetSrc2(instr);
      pRVar6 = IR::Opnd::AsRegOpnd(pOVar5);
      RVar4 = IR::RegOpnd::GetReg(pRVar6);
      Peeps::ClearReg(pPVar1,RVar4);
    }
  }
  return;
}

Assistant:

void
PeepsMD::ProcessImplicitRegs(IR::Instr *instr)
{
    if (LowererMD::IsCall(instr))
    {
#define REGDAT(Name, Listing, Encode, Type, BitVec) \
        if (!((BitVec) & (RA_CALLEESAVE | RA_DONTALLOCATE))) \
        { \
            this->peeps->ClearReg(Reg ## Name); \
        }
#include "RegList.h"
    }
    else if (instr->m_opcode == Js::OpCode::IMUL)
    {
        this->peeps->ClearReg(RegRDX);
    }
    else if (instr->m_opcode == Js::OpCode::IDIV || instr->m_opcode == Js::OpCode::DIV)
    {
        if (instr->GetDst()->AsRegOpnd()->GetReg() == RegRDX)
        {
            this->peeps->ClearReg(RegRAX);
        }
        else
        {
            Assert(instr->GetDst()->AsRegOpnd()->GetReg() == RegRAX);
            this->peeps->ClearReg(RegRDX);
        }
    }
    else if (instr->m_opcode == Js::OpCode::XCHG)
    {
        // At time of writing, I believe that src1 is always identical to dst, but clear both for robustness.

        // Either of XCHG's operands (but not both) can be a memory address, so only clear registers.
        if (instr->GetSrc1()->IsRegOpnd())
        {
            this->peeps->ClearReg(instr->GetSrc1()->AsRegOpnd()->GetReg());
        }
        if (instr->GetSrc2()->IsRegOpnd())
        {
            this->peeps->ClearReg(instr->GetSrc2()->AsRegOpnd()->GetReg());
        }
    }
}